

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

void lws_cmdline_option_handle_builtin(int argc,char **argv,lws_context_creation_info *info)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  int iVar3;
  long lVar4;
  int local_34;
  
  local_34 = 0x407;
  lVar4 = 0;
  piVar2 = &builtins_rel;
  do {
    __nptr = lws_cmdline_option(argc,argv,(char *)((long)&builtins_rel + (long)*piVar2));
    if (__nptr != (char *)0x0) {
      iVar1 = atoi(__nptr);
      iVar3 = (int)lVar4;
      if (iVar3 == 2) {
        info->udp_loss_sim_rx_pc = (uint8_t)iVar1;
      }
      else if (iVar3 == 1) {
        info->udp_loss_sim_tx_pc = (uint8_t)iVar1;
      }
      else if (iVar3 == 0) {
        local_34 = iVar1;
      }
    }
    lVar4 = lVar4 + 1;
    piVar2 = piVar2 + 1;
  } while (lVar4 != 3);
  lws_set_log_level(local_34,(_func_void_int_char_ptr *)0x0);
  return;
}

Assistant:

void
lws_cmdline_option_handle_builtin(int argc, const char **argv,
				  struct lws_context_creation_info *info)
{
	const char *p;
	int n, m, logs = LLL_USER | LLL_ERR | LLL_WARN | LLL_NOTICE;

	for (n = 0; n < (int)LWS_ARRAY_SIZE(builtins); n++) {
		p = lws_cmdline_option(argc, argv, builtins[n]);
		if (!p)
			continue;

		m = atoi(p);

		switch (n) {
		case 0:
			logs = m;
			break;
		case 1:
			info->udp_loss_sim_tx_pc = m;
			break;
		case 2:
			info->udp_loss_sim_rx_pc = m;
			break;
		}
	}

	lws_set_log_level(logs, NULL);
}